

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Widget_Type.cxx
# Opt level: O3

void labelcolor_cb(Fl_Button *i,void *v)

{
  Fl_Color FVar1;
  int iVar2;
  Fl_Color FVar3;
  Fl_Widget_Type *q;
  Fl_Widget_Type *this;
  bool bVar4;
  
  FVar3 = (current_widget->o->label_).color;
  if ((char *)v != "LOAD") {
    FVar1 = fl_show_colormap(FVar3);
    if (FVar1 == FVar3) {
      return;
    }
    FVar3 = FVar1;
    if (Fl_Type::first != (Fl_Type *)0x0) {
      bVar4 = true;
      this = (Fl_Widget_Type *)Fl_Type::first;
      do {
        while (((this->super_Fl_Type).selected != '\0' &&
               (iVar2 = (*(this->super_Fl_Type)._vptr_Fl_Type[0x17])(this), iVar2 != 0))) {
          (this->o->label_).color = FVar1;
          Fl_Widget_Type::redraw(this);
          this = (Fl_Widget_Type *)(this->super_Fl_Type).next;
          bVar4 = false;
          if (this == (Fl_Widget_Type *)0x0) goto LAB_001850f6;
        }
        this = (Fl_Widget_Type *)(this->super_Fl_Type).next;
      } while (this != (Fl_Widget_Type *)0x0);
      if (!bVar4) {
LAB_001850f6:
        set_modflag(1);
      }
    }
  }
  (i->super_Fl_Widget).color_ = FVar3;
  FVar3 = fl_contrast(0x38,FVar3);
  (i->super_Fl_Widget).label_.color = FVar3;
  Fl_Widget::redraw(&i->super_Fl_Widget);
  return;
}

Assistant:

void labelcolor_cb(Fl_Button* i, void *v) {
  Fl_Color c = current_widget->o->labelcolor();
  if (v != LOAD) {
    int mod = 0;
    Fl_Color d = fl_show_colormap(c);
    if (d == c) return;
    c = d;
    for (Fl_Type *o = Fl_Type::first; o; o = o->next) {
      if (o->selected && o->is_widget()) {
	Fl_Widget_Type* q = (Fl_Widget_Type*)o;
	q->o->labelcolor(c); q->redraw();
	mod = 1;
      }
    }
    if (mod) set_modflag(1);
  }
  i->color(c); i->labelcolor(fl_contrast(FL_BLACK,c)); i->redraw();
}